

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseField
          (ExtensionSet *this,uint32 tag,CodedInputStream *input,Message *containing_type,
          UnknownFieldSet *unknown_fields)

{
  DescriptorPool *extension_finder;
  DescriptorPoolExtensionFinder *this_00;
  DescriptorPool *pool;
  CodedInputStream *in_RDX;
  FieldSkipper *in_RDI;
  DescriptorPoolExtensionFinder finder_1;
  GeneratedExtensionFinder finder;
  UnknownFieldSetFieldSkipper skipper;
  Descriptor *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  CodedInputStream *in_stack_ffffffffffffff78;
  uint32 in_stack_ffffffffffffff84;
  ExtensionSet *in_stack_ffffffffffffff88;
  undefined1 local_1;
  
  UnknownFieldSetFieldSkipper::UnknownFieldSetFieldSkipper
            ((UnknownFieldSetFieldSkipper *)
             CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
             (UnknownFieldSet *)in_stack_ffffffffffffff38);
  extension_finder = io::CodedInputStream::GetExtensionPool(in_RDX);
  if (extension_finder == (DescriptorPool *)0x0) {
    GeneratedExtensionFinder::GeneratedExtensionFinder
              ((GeneratedExtensionFinder *)
               CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               (MessageLite *)in_stack_ffffffffffffff38);
    local_1 = ParseField(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                         in_stack_ffffffffffffff78,(ExtensionFinder *)extension_finder,in_RDI);
    GeneratedExtensionFinder::~GeneratedExtensionFinder((GeneratedExtensionFinder *)0x555ca2);
  }
  else {
    io::CodedInputStream::GetExtensionPool(in_RDX);
    this_00 = (DescriptorPoolExtensionFinder *)io::CodedInputStream::GetExtensionFactory(in_RDX);
    pool = (DescriptorPool *)
           Message::GetDescriptor
                     ((Message *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
    DescriptorPoolExtensionFinder::DescriptorPoolExtensionFinder
              (this_00,pool,
               (MessageFactory *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
               in_stack_ffffffffffffff38);
    local_1 = ParseField(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                         in_stack_ffffffffffffff78,(ExtensionFinder *)extension_finder,in_RDI);
    DescriptorPoolExtensionFinder::~DescriptorPoolExtensionFinder
              ((DescriptorPoolExtensionFinder *)0x555d7f);
  }
  UnknownFieldSetFieldSkipper::~UnknownFieldSetFieldSkipper((UnknownFieldSetFieldSkipper *)0x555dab)
  ;
  return local_1;
}

Assistant:

bool ExtensionSet::ParseField(uint32 tag, io::CodedInputStream* input,
                              const Message* containing_type,
                              UnknownFieldSet* unknown_fields) {
  UnknownFieldSetFieldSkipper skipper(unknown_fields);
  if (input->GetExtensionPool() == NULL) {
    GeneratedExtensionFinder finder(containing_type);
    return ParseField(tag, input, &finder, &skipper);
  } else {
    DescriptorPoolExtensionFinder finder(input->GetExtensionPool(),
                                         input->GetExtensionFactory(),
                                         containing_type->GetDescriptor());
    return ParseField(tag, input, &finder, &skipper);
  }
}